

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still_test.cpp
# Opt level: O0

float getParamVal(string *id,int argc,char **argv,float defvalue)

{
  bool bVar1;
  long in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  int i;
  char *in_stack_ffffffffffffffc8;
  int local_28;
  
  local_28 = 0;
  while( true ) {
    if (in_ESI <= local_28) {
      return in_XMM0_Da;
    }
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffc8);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  dVar2 = atof(*(char **)(in_RDX + (long)(local_28 + 1) * 8));
  return (float)dVar2;
}

Assistant:

float getParamVal ( string id,int argc,char **argv,float defvalue ) {
    for ( int i=0; i<argc; i++ )
        if ( id== argv[i] )
            return atof ( argv[i+1] );
    return defvalue;
}